

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

string * __thiscall
spectest::JSONParser::CreateModulePath_abi_cxx11_
          (string *__return_storage_ptr__,JSONParser *this,string_view filename)

{
  size_type sVar1;
  char *in_R8;
  string_view x;
  string_view path_00;
  string_view y;
  string local_c8;
  string local_a8;
  allocator<char> local_81;
  string local_80 [39];
  undefined1 local_59;
  spectest *local_58;
  char *local_50;
  undefined1 local_48 [8];
  string_view dirname;
  string_view spec_json_filename;
  JSONParser *this_local;
  string_view filename_local;
  string *path;
  
  filename_local._M_len = (size_t)filename._M_str;
  path_00._M_str = (JSONParser *)filename._M_len;
  local_58 = (spectest *)(this->loc_).filename._M_len;
  local_50 = (this->loc_).filename._M_str;
  path_00._M_len = (size_t)local_50;
  dirname._M_str = (char *)local_58;
  this_local = path_00._M_str;
  filename_local._M_str = (char *)__return_storage_ptr__;
  _local_48 = GetDirname(local_58,path_00);
  local_59 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_48);
  if (sVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_80,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_81);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_80);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  else {
    x._M_str = "/";
    x._M_len = dirname._M_len;
    wabt::operator+[abi_cxx11_(&local_c8,(wabt *)local_48,x,in_R8);
    y._M_str = in_R8;
    y._M_len = filename_local._M_len;
    wabt::operator+(&local_a8,(wabt *)&local_c8,(string *)this_local,y);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  wabt::ConvertBackslashToSlash(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string JSONParser::CreateModulePath(std::string_view filename) {
  std::string_view spec_json_filename = loc_.filename;
  std::string_view dirname = GetDirname(spec_json_filename);
  std::string path;

  if (dirname.size() == 0) {
    path = std::string(filename);
  } else {
    path = dirname + "/" + filename;
  }

  ConvertBackslashToSlash(&path);
  return path;
}